

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine_unix.cpp
# Opt level: O0

bool __thiscall
QNativeSocketEnginePrivate::fetchConnectionParameters(QNativeSocketEnginePrivate *this)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  quint16 *in_RDI;
  long in_FS_OFFSET;
  bool connected;
  socklen_t valueSize;
  int value;
  socklen_t optlen;
  int ipv6only;
  socklen_t sockAddrSize;
  qt_sockaddr sa;
  undefined4 in_stack_ffffffffffffff78;
  SpecialAddress in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  SpecialAddress in_stack_ffffffffffffffa4;
  socklen_t in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int iVar4;
  char local_50 [32];
  socklen_t local_30;
  int local_2c [2];
  sockaddr local_24;
  undefined8 local_14;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI[0x58] = 0;
  QHostAddress::clear((QHostAddress *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
  ;
  in_RDI[0x60] = 0;
  QHostAddress::clear((QHostAddress *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
  ;
  in_RDI[100] = 0;
  in_RDI[0x65] = 0;
  in_RDI[0x62] = 0;
  in_RDI[99] = 0;
  if (*(long *)(in_RDI + 0x6c) == -1) {
    bVar1 = false;
  }
  else {
    local_24.sa_family = 0xaaaa;
    local_24.sa_data[0] = -0x56;
    local_24.sa_data[1] = -0x56;
    local_24.sa_data[2] = -0x56;
    local_24.sa_data[3] = -0x56;
    local_24.sa_data[4] = -0x56;
    local_24.sa_data[5] = -0x56;
    local_24.sa_data[6] = -0x56;
    local_24.sa_data[7] = -0x56;
    local_24.sa_data[8] = -0x56;
    local_24.sa_data[9] = -0x56;
    local_24.sa_data[10] = -0x56;
    local_24.sa_data[0xb] = -0x56;
    local_24.sa_data[0xc] = -0x56;
    local_24.sa_data[0xd] = -0x56;
    local_14 = 0xaaaaaaaaaaaaaaaa;
    local_c = 0xaaaaaaaa;
    local_2c[1] = 0x1c;
    memset(&local_24,0,0x1c);
    iVar2 = getsockname((int)*(undefined8 *)(in_RDI + 0x6c),&local_24,(socklen_t *)(local_2c + 1));
    if (iVar2 == 0) {
      qt_socket_getPortAndAddress
                ((qt_sockaddr *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),in_RDI
                 ,(QHostAddress *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      in_stack_ffffffffffffff84 = (uint)local_24.sa_family;
      if (in_stack_ffffffffffffff84 == 2) {
        in_RDI[0x50] = 0;
        in_RDI[0x51] = 0;
      }
      else if (in_stack_ffffffffffffff84 == 10) {
        in_RDI[0x50] = 1;
        in_RDI[0x51] = 0;
      }
      else {
        in_RDI[0x50] = 0xffff;
        in_RDI[0x51] = 0xffff;
      }
    }
    else {
      piVar3 = __errno_location();
      if (*piVar3 == 9) {
        setError((QNativeSocketEnginePrivate *)
                 CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                 (SocketError)((ulong)in_RDI >> 0x20),(ErrorString)in_RDI);
        bVar1 = false;
        goto LAB_0035c895;
      }
    }
    local_2c[0] = 0;
    local_30 = 4;
    if ((*(int *)(in_RDI + 0x50) == 1) &&
       (((bVar1 = QHostAddress::operator==
                            ((QHostAddress *)
                             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                             in_stack_ffffffffffffffa4), bVar1 ||
         (bVar1 = QHostAddress::operator==
                            ((QHostAddress *)
                             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                             in_stack_ffffffffffffffa4), bVar1)) &&
        (iVar2 = getsockopt((int)*(undefined8 *)(in_RDI + 0x6c),0x29,0x1a,local_2c,&local_30),
        iVar2 == 0)))) {
      if (local_30 != 4) {
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                   (char *)in_RDI,in_stack_ffffffffffffff84,
                   (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        QMessageLogger::warning(local_50,"unexpected size of IPV6_V6ONLY socket option");
      }
      if (local_2c[0] == 0) {
        in_RDI[0x50] = 2;
        in_RDI[0x51] = 0;
        QHostAddress::operator=
                  ((QHostAddress *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff7c);
      }
    }
    iVar2 = getpeername((int)*(undefined8 *)(in_RDI + 0x6c),&local_24,(socklen_t *)(local_2c + 1));
    if (iVar2 == 0) {
      qt_socket_getPortAndAddress
                ((qt_sockaddr *)CONCAT17(iVar2 == 0,in_stack_ffffffffffffff90),in_RDI,
                 (QHostAddress *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      in_RDI[100] = 1;
      in_RDI[0x65] = 0;
      in_RDI[0x62] = 1;
      in_RDI[99] = 0;
    }
    iVar4 = 0;
    iVar2 = getsockopt((int)*(undefined8 *)(in_RDI + 0x6c),1,3,&stack0xffffffffffffffac,
                       (socklen_t *)&stack0xffffffffffffffa8);
    if (iVar2 == 0) {
      if (iVar4 == 1) {
        in_RDI[0x4e] = 0;
        in_RDI[0x4f] = 0;
      }
      else if (iVar4 == 2) {
        in_RDI[0x4e] = 1;
        in_RDI[0x4f] = 0;
      }
      else {
        in_RDI[0x4e] = 0xffff;
        in_RDI[0x4f] = 0xffff;
      }
    }
    bVar1 = true;
  }
LAB_0035c895:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QNativeSocketEnginePrivate::fetchConnectionParameters()
{
    localPort = 0;
    localAddress.clear();
    peerPort = 0;
    peerAddress.clear();
    inboundStreamCount = outboundStreamCount = 0;

    if (socketDescriptor == -1)
        return false;

    qt_sockaddr sa;
    QT_SOCKLEN_T sockAddrSize = sizeof(sa);

    // Determine local address
    memset(&sa, 0, sizeof(sa));
    if (::getsockname(socketDescriptor, &sa.a, &sockAddrSize) == 0) {
        qt_socket_getPortAndAddress(&sa, &localPort, &localAddress);

        // Determine protocol family
        switch (sa.a.sa_family) {
        case AF_INET:
            socketProtocol = QAbstractSocket::IPv4Protocol;
            break;
        case AF_INET6:
            socketProtocol = QAbstractSocket::IPv6Protocol;
            break;
        default:
            socketProtocol = QAbstractSocket::UnknownNetworkLayerProtocol;
            break;
        }

    } else if (errno == EBADF) {
        setError(QAbstractSocket::UnsupportedSocketOperationError, InvalidSocketErrorString);
        return false;
    }

#if defined (IPV6_V6ONLY)
    // determine if local address is dual mode
    // On linux, these are returned as "::" (==AnyIPv6)
    // On OSX, these are returned as "::FFFF:0.0.0.0" (==AnyIPv4)
    // in either case, the IPV6_V6ONLY option is cleared
    int ipv6only = 0;
    socklen_t optlen = sizeof(ipv6only);
    if (socketProtocol == QAbstractSocket::IPv6Protocol
        && (localAddress == QHostAddress::AnyIPv4 || localAddress == QHostAddress::AnyIPv6)
        && !getsockopt(socketDescriptor, IPPROTO_IPV6, IPV6_V6ONLY, (char*)&ipv6only, &optlen )) {
            if (optlen != sizeof(ipv6only))
                qWarning("unexpected size of IPV6_V6ONLY socket option");
            if (!ipv6only) {
                socketProtocol = QAbstractSocket::AnyIPProtocol;
                localAddress = QHostAddress::Any;
            }
    }
#endif

    // Determine the remote address
    bool connected = ::getpeername(socketDescriptor, &sa.a, &sockAddrSize) == 0;
    if (connected) {
        qt_socket_getPortAndAddress(&sa, &peerPort, &peerAddress);
        inboundStreamCount = outboundStreamCount = 1;
    }

    // Determine the socket type (UDP/TCP/SCTP)
    int value = 0;
    QT_SOCKOPTLEN_T valueSize = sizeof(int);
    if (::getsockopt(socketDescriptor, SOL_SOCKET, SO_TYPE, &value, &valueSize) == 0) {
        if (value == SOCK_STREAM) {
#ifndef QT_NO_SCTP
            if (option(QNativeSocketEngine::MaxStreamsSocketOption) != -1) {
                socketType = QAbstractSocket::SctpSocket;
                if (connected) {
                    sctp_status sctpStatus;
                    QT_SOCKOPTLEN_T sctpStatusSize = sizeof(sctpStatus);
                    sctp_event_subscribe sctpEvents;

                    memset(&sctpEvents, 0, sizeof(sctpEvents));
                    sctpEvents.sctp_data_io_event = 1;
                    if (::getsockopt(socketDescriptor, SOL_SCTP, SCTP_STATUS, &sctpStatus,
                                     &sctpStatusSize) == 0 &&
                        ::setsockopt(socketDescriptor, SOL_SCTP, SCTP_EVENTS, &sctpEvents,
                                     sizeof(sctpEvents)) == 0) {
                        inboundStreamCount = int(sctpStatus.sstat_instrms);
                        outboundStreamCount = int(sctpStatus.sstat_outstrms);
                    } else {
                        setError(QAbstractSocket::UnsupportedSocketOperationError,
                                 InvalidSocketErrorString);
                        return false;
                    }
                }
            } else {
                socketType = QAbstractSocket::TcpSocket;
            }
#else
                socketType = QAbstractSocket::TcpSocket;
#endif
        } else {
            if (value == SOCK_DGRAM)
                socketType = QAbstractSocket::UdpSocket;
            else
                socketType = QAbstractSocket::UnknownSocketType;
        }
    }
#if defined (QNATIVESOCKETENGINE_DEBUG)
    QString socketProtocolStr = QStringLiteral("UnknownProtocol");
    if (socketProtocol == QAbstractSocket::IPv4Protocol) socketProtocolStr = QStringLiteral("IPv4Protocol");
    else if (socketProtocol == QAbstractSocket::IPv6Protocol || socketProtocol == QAbstractSocket::AnyIPProtocol) socketProtocolStr = QStringLiteral("IPv6Protocol");

    QString socketTypeStr = QStringLiteral("UnknownSocketType");
    if (socketType == QAbstractSocket::TcpSocket) socketTypeStr = QStringLiteral("TcpSocket");
    else if (socketType == QAbstractSocket::UdpSocket) socketTypeStr = QStringLiteral("UdpSocket");
    else if (socketType == QAbstractSocket::SctpSocket) socketTypeStr = QStringLiteral("SctpSocket");

    qDebug("QNativeSocketEnginePrivate::fetchConnectionParameters() local == %s:%i,"
           " peer == %s:%i, socket == %s - %s, inboundStreamCount == %i, outboundStreamCount == %i",
           localAddress.toString().toLatin1().constData(), localPort,
           peerAddress.toString().toLatin1().constData(), peerPort,socketTypeStr.toLatin1().constData(),
           socketProtocolStr.toLatin1().constData(), inboundStreamCount, outboundStreamCount);
#endif
    return true;
}